

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Vec4f __thiscall embree::XMLLoader::load<embree::Vec4<float>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  size_type sVar1;
  runtime_error *this_00;
  long *in_RDX;
  float *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 in_XMM1_Qa;
  Vec4f VVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 in_stack_ffffffffffffff67;
  Token *in_stack_ffffffffffffff68;
  string local_90 [32];
  long *local_70;
  long *local_58;
  long *local_50;
  ParseLocation *in_stack_ffffffffffffffb8;
  
  local_70 = in_RDX;
  sVar1 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar1 != 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_70;
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffb8);
    std::operator+(__lhs,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_90);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_70 + 0x98),0);
  fVar2 = Token::Float(in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_70 + 0x98),1);
  fVar3 = Token::Float(in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
  local_50 = local_70;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_70 + 0x98),2);
  fVar4 = Token::Float(in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
  local_58 = local_70;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_70 + 0x98),3);
  VVar5.field_0._0_4_ = Token::Float(in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
  *in_RDI = fVar2;
  in_RDI[1] = fVar3;
  in_RDI[2] = fVar4;
  VVar5.field_0.field_0.y = 0.0;
  in_RDI[3] = VVar5.field_0._0_4_;
  VVar5.field_0._8_8_ = in_XMM1_Qa;
  return (Vec4f)VVar5.field_0;
}

Assistant:

Vec4f XMLLoader::load<Vec4f>(const Ref<XML>& xml) {
    if (xml->body.size() != 4) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float4 body");
    return Vec4f(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float(),xml->body[3].Float());
  }